

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcAbs.c
# Opt level: O0

int Wla_ManSolve(Wla_Man_t *pWla,Wlc_Par_t *pPars)

{
  int iVar1;
  abctime aVar2;
  Wlc_Ntk_t *pAbs_00;
  Aig_Man_t *pAig_00;
  abctime aVar3;
  long time;
  double local_90;
  double local_80;
  double local_70;
  double local_60;
  double local_50;
  int local_3c;
  int RetValue;
  Aig_Man_t *pAig;
  Wlc_Ntk_t *pAbs;
  abctime tTotal;
  abctime clk;
  Wlc_Par_t *pPars_local;
  Wla_Man_t *pWla_local;
  
  aVar2 = Abc_Clock();
  local_3c = -1;
  pWla->nIters = 1;
  while (pWla->nIters < pPars->nIterMax) {
    if (pPars->fVerbose != 0) {
      printf("\nIteration %d:\n",(ulong)(uint)pWla->nIters);
    }
    pAbs_00 = Wla_ManCreateAbs(pWla);
    pAig_00 = Wla_ManBitBlast(pWla,pAbs_00);
    Wlc_NtkFree(pAbs_00);
    local_3c = Wla_ManSolveInt(pWla,pAig_00);
    Aig_ManStop(pAig_00);
    if ((local_3c != -1) ||
       ((pPars->pFuncStop != (_func_int_int *)0x0 &&
        (iVar1 = (*pPars->pFuncStop)(pPars->RunId), iVar1 != 0)))) break;
    Wla_ManRefine(pWla);
    pWla->nIters = pWla->nIters + 1;
  }
  if (pPars->fVerbose != 0) {
    printf("\n");
  }
  printf("Abstraction ");
  if (local_3c == 0) {
    printf("resulted in a real CEX");
  }
  else if (local_3c == 1) {
    printf("is successfully proved");
  }
  else {
    printf("timed out");
  }
  printf(" after %d iterations. ",(ulong)(uint)pWla->nIters);
  aVar3 = Abc_Clock();
  time = aVar3 - aVar2;
  Abc_PrintTime(1,"Time",time);
  if (pPars->fVerbose != 0) {
    Abc_Print(1,"PDRA reused %d clauses.\n",(ulong)(uint)pWla->nTotalCla);
  }
  if (pPars->fVerbose != 0) {
    Abc_Print(1,"%s =","PDR          ");
    if (((double)time != 0.0) || (NAN((double)time))) {
      local_50 = ((double)pWla->tPdr * 100.0) / (double)time;
    }
    else {
      local_50 = 0.0;
    }
    Abc_Print(1,"%9.2f sec (%6.2f %%)\n",((double)pWla->tPdr * 1.0) / 1000000.0,local_50);
    Abc_Print(1,"%s =","CEX Refine   ");
    if (((double)time != 0.0) || (NAN((double)time))) {
      local_60 = ((double)pWla->tCbr * 100.0) / (double)time;
    }
    else {
      local_60 = 0.0;
    }
    Abc_Print(1,"%9.2f sec (%6.2f %%)\n",((double)pWla->tCbr * 1.0) / 1000000.0,local_60);
    Abc_Print(1,"%s =","Proof Refine ");
    if (((double)time != 0.0) || (NAN((double)time))) {
      local_70 = ((double)pWla->tPbr * 100.0) / (double)time;
    }
    else {
      local_70 = 0.0;
    }
    Abc_Print(1,"%9.2f sec (%6.2f %%)\n",((double)pWla->tPbr * 1.0) / 1000000.0,local_70);
    Abc_Print(1,"%s =","Misc.        ");
    if (((double)time != 0.0) || (NAN((double)time))) {
      local_80 = ((double)(((time - pWla->tPdr) - pWla->tCbr) - pWla->tPbr) * 100.0) / (double)time;
    }
    else {
      local_80 = 0.0;
    }
    Abc_Print(1,"%9.2f sec (%6.2f %%)\n",
              ((double)(((time - pWla->tPdr) - pWla->tCbr) - pWla->tPbr) * 1.0) / 1000000.0,local_80
             );
    Abc_Print(1,"%s =","Total        ");
    if (((double)time != 0.0) || (NAN((double)time))) {
      local_90 = ((double)time * 100.0) / (double)time;
    }
    else {
      local_90 = 0.0;
    }
    Abc_Print(1,"%9.2f sec (%6.2f %%)\n",((double)time * 1.0) / 1000000.0,local_90);
  }
  return local_3c;
}

Assistant:

int Wla_ManSolve( Wla_Man_t * pWla, Wlc_Par_t * pPars )
{
    abctime clk = Abc_Clock();
    abctime tTotal;
    Wlc_Ntk_t * pAbs = NULL;
    Aig_Man_t * pAig = NULL;

    int RetValue = -1;

    // perform refinement iterations
    for ( pWla->nIters = 1; pWla->nIters < pPars->nIterMax; ++pWla->nIters )
    {
        if ( pPars->fVerbose )
            printf( "\nIteration %d:\n", pWla->nIters );

        pAbs = Wla_ManCreateAbs( pWla );

        pAig = Wla_ManBitBlast( pWla, pAbs );
        Wlc_NtkFree( pAbs );

        RetValue = Wla_ManSolveInt( pWla, pAig );
        Aig_ManStop( pAig );

        if ( RetValue != -1 || (pPars->pFuncStop && pPars->pFuncStop( pPars->RunId)) )
            break;

        Wla_ManRefine( pWla );
    }

    // report the result
    if ( pPars->fVerbose )
        printf( "\n" );
    printf( "Abstraction " );
    if ( RetValue == 0 )
        printf( "resulted in a real CEX" );
    else if ( RetValue == 1 )
        printf( "is successfully proved" );
    else 
        printf( "timed out" );
    printf( " after %d iterations. ", pWla->nIters );
    tTotal = Abc_Clock() - clk;
    Abc_PrintTime( 1, "Time", tTotal );

    if ( pPars->fVerbose )
        Abc_Print( 1, "PDRA reused %d clauses.\n", pWla->nTotalCla );
    if ( pPars->fVerbose )
    {
        ABC_PRTP( "PDR          ", pWla->tPdr,                          tTotal );
        ABC_PRTP( "CEX Refine   ", pWla->tCbr,                          tTotal );
        ABC_PRTP( "Proof Refine ", pWla->tPbr,                          tTotal );
        ABC_PRTP( "Misc.        ", tTotal - pWla->tPdr - pWla->tCbr - pWla->tPbr,   tTotal );
        ABC_PRTP( "Total        ", tTotal,                              tTotal );
    }

    return RetValue;
}